

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

int http_sse_write(http_sse_s *sse,http_sse_write_args args)

{
  char *pcVar1;
  int iVar2;
  FIOBJ dest;
  char *pcVar3;
  FIOBJ obj;
  
  if (((sse != (http_sse_s *)0x0) && (args.data.len + args.id.len + args.event.len != 0)) &&
     (iVar2 = fio_is_closed((intptr_t)sse[1].on_open), iVar2 == 0)) {
    dest = fiobj_str_buf(args.data.len + args.id.len + args.event.len + 0x2c);
    if (args.id.len != 0) {
      pcVar1 = args.id.data + args.id.len;
      do {
        fiobj_str_write(dest,"id: ",4);
        for (pcVar3 = args.id.data; ((pcVar3 < pcVar1 && (*pcVar3 != '\n')) && (*pcVar3 != '\r'));
            pcVar3 = pcVar3 + 1) {
        }
        fiobj_str_write(dest,args.id.data,(long)pcVar3 - (long)args.id.data);
        fiobj_str_write(dest,"\r\n",2);
        args.id.len = (size_t)(args.id.data +
                              (args.id.len -
                              (long)(pcVar3 + (ulong)(pcVar3[*pcVar3 == '\r'] == '\n') +
                                              (ulong)(*pcVar3 == '\r'))));
        args.id.data = pcVar3 + (ulong)(pcVar3[*pcVar3 == '\r'] == '\n') + (ulong)(*pcVar3 == '\r');
      } while ((char *)args.id.len != (char *)0x0);
    }
    if (args.event.len != 0) {
      pcVar1 = args.event.data + args.event.len;
      do {
        fiobj_str_write(dest,"event: ",7);
        for (pcVar3 = args.event.data; ((pcVar3 < pcVar1 && (*pcVar3 != '\n')) && (*pcVar3 != '\r'))
            ; pcVar3 = pcVar3 + 1) {
        }
        fiobj_str_write(dest,args.event.data,(long)pcVar3 - (long)args.event.data);
        fiobj_str_write(dest,"\r\n",2);
        args.event.len =
             (size_t)(args.event.data +
                     (args.event.len -
                     (long)(pcVar3 + (ulong)(pcVar3[*pcVar3 == '\r'] == '\n') +
                                     (ulong)(*pcVar3 == '\r'))));
        args.event.data =
             pcVar3 + (ulong)(pcVar3[*pcVar3 == '\r'] == '\n') + (ulong)(*pcVar3 == '\r');
      } while ((char *)args.event.len != (char *)0x0);
    }
    if (args.retry != 0) {
      if (args.retry + 0x4000000000000000 < 0) {
        obj = fiobj_num_new_bignum(args.retry);
      }
      else {
        obj = (args.retry * 2 | args.retry & 0x8000000000000000U) + 1;
      }
      fiobj_str_write(dest,"retry: ",7);
      fiobj_str_concat(dest,obj);
      fiobj_free(obj);
    }
    if (args.data.len != 0) {
      pcVar1 = args.data.data + args.data.len;
      do {
        fiobj_str_write(dest,"data: ",6);
        for (pcVar3 = args.data.data; ((pcVar3 < pcVar1 && (*pcVar3 != '\n')) && (*pcVar3 != '\r'));
            pcVar3 = pcVar3 + 1) {
        }
        fiobj_str_write(dest,args.data.data,(long)pcVar3 - (long)args.data.data);
        fiobj_str_write(dest,"\r\n",2);
        args.data.len =
             (size_t)(args.data.data +
                     (args.data.len -
                     (long)(pcVar3 + (ulong)(pcVar3[*pcVar3 == '\r'] == '\n') +
                                     (ulong)(*pcVar3 == '\r'))));
        args.data.data =
             pcVar3 + (ulong)(pcVar3[*pcVar3 == '\r'] == '\n') + (ulong)(*pcVar3 == '\r');
      } while ((char *)args.data.len != (char *)0x0);
    }
    fiobj_str_write(dest,"\r\n",2);
    iVar2 = (**(code **)(sse[1].on_ready + 0x58))(sse,dest);
    return iVar2;
  }
  return -1;
}

Assistant:

int http_sse_write(http_sse_s *sse, struct http_sse_write_args args) {
  if (!sse || !(args.id.len + args.data.len + args.event.len) ||
      fio_is_closed(FIO_LS_EMBD_OBJ(http_sse_internal_s, sse, sse)->uuid))
    return -1;
  FIOBJ buf;
  {
    /* best guess at data length, ignoring missing fields and multiline data */
    const size_t total = 4 + args.id.len + 2 + 7 + args.event.len + 2 + 6 +
                         args.data.len + 2 + 7 + 10 + 4;
    buf = fiobj_str_buf(total);
  }
  http_sse_copy2str(buf, (char *)"id: ", 4, args.id);
  http_sse_copy2str(buf, (char *)"event: ", 7, args.event);
  if (args.retry) {
    FIOBJ i = fiobj_num_new(args.retry);
    fiobj_str_write(buf, (char *)"retry: ", 7);
    fiobj_str_join(buf, i);
    fiobj_free(i);
  }
  http_sse_copy2str(buf, (char *)"data: ", 6, args.data);
  fiobj_str_write(buf, "\r\n", 2);
  return FIO_LS_EMBD_OBJ(http_sse_internal_s, sse, sse)
      ->vtable->http_sse_write(sse, buf);
}